

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_32x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  undefined8 *puVar1;
  byte bVar2;
  code *pcVar3;
  code *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int8_t *piVar8;
  int32_t *piVar9;
  undefined7 in_register_00000009;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  int iVar13;
  long lVar14;
  ulong *puVar15;
  int *piVar16;
  __m128i round;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 in_XMM2 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i in [128];
  undefined8 uStack_898;
  undefined8 uStack_890;
  ulong auStack_888 [2];
  ulong auStack_878 [2];
  undefined8 auStack_868 [2];
  undefined8 uStack_858;
  undefined8 uStack_850;
  ulong auStack_848 [2];
  ulong auStack_838 [2];
  undefined8 local_828;
  int aiStack_820 [254];
  longlong local_428 [128];
  undefined1 auVar19 [16];
  
  piVar8 = av1_fwd_txfm_shift_ls[10];
  uVar10 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar3 = *(code **)((long)row_highbd_txfm8x32_arr + uVar10);
  pcVar4 = *(code **)((long)col_highbd_txfm8x32_arr + uVar10);
  iVar13 = (int)*av1_fwd_txfm_shift_ls[10];
  puVar15 = (ulong *)(input + 0x1c);
  lVar11 = 0x70;
  do {
    *(ulong *)((long)&uStack_898 + lVar11) = puVar15[-7];
    *(undefined8 *)((long)&uStack_890 + lVar11) = 0;
    *(ulong *)((long)auStack_888 + lVar11) = puVar15[-6];
    *(undefined8 *)((long)auStack_888 + lVar11 + 8) = 0;
    *(ulong *)((long)auStack_878 + lVar11) = puVar15[-5];
    *(undefined8 *)((long)auStack_878 + lVar11 + 8) = 0;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = puVar15[-4];
    *(undefined1 (*) [16])((long)auStack_868 + lVar11) = auVar17;
    auVar17 = pmovsxwd(auVar17,*(undefined8 *)((long)&uStack_898 + lVar11));
    auVar20 = pmovsxwd(in_XMM2,*(undefined8 *)((long)auStack_888 + lVar11));
    auVar22 = pmovsxwd(in_XMM3,*(undefined8 *)((long)auStack_878 + lVar11));
    auVar27 = pmovsxwd(in_XMM4,*(undefined8 *)((long)auStack_868 + lVar11));
    auVar24._0_4_ = auVar20._0_4_ << iVar13;
    auVar24._4_4_ = auVar20._4_4_;
    auVar24._8_4_ = auVar20._8_4_;
    auVar24._12_4_ = auVar20._12_4_;
    *(int *)((long)&uStack_898 + lVar11) = auVar17._0_4_ << iVar13;
    *(int *)((long)&uStack_898 + lVar11 + 4) = auVar17._4_4_;
    *(int *)((long)&uStack_890 + lVar11) = auVar17._8_4_;
    *(int *)((long)auStack_888 + lVar11 + -4) = auVar17._12_4_;
    *(undefined1 (*) [16])((long)auStack_888 + lVar11) = auVar24;
    auVar23._0_4_ = auVar22._0_4_ << iVar13;
    auVar23._4_4_ = auVar22._4_4_;
    auVar23._8_4_ = auVar22._8_4_;
    auVar23._12_4_ = auVar22._12_4_;
    *(undefined1 (*) [16])((long)auStack_878 + lVar11) = auVar23;
    auVar22._0_4_ = auVar27._0_4_ << iVar13;
    auVar22._4_4_ = auVar27._4_4_;
    auVar22._8_4_ = auVar27._8_4_;
    auVar22._12_4_ = auVar27._12_4_;
    *(undefined1 (*) [16])((long)auStack_868 + lVar11) = auVar22;
    *(ulong *)((long)&uStack_858 + lVar11) = puVar15[-3];
    *(undefined8 *)((long)&uStack_850 + lVar11) = 0;
    *(ulong *)((long)auStack_848 + lVar11) = puVar15[-2];
    *(undefined8 *)((long)auStack_848 + lVar11 + 8) = 0;
    *(ulong *)((long)auStack_838 + lVar11) = puVar15[-1];
    *(undefined8 *)((long)auStack_838 + lVar11 + 8) = 0;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *puVar15;
    *(undefined1 (*) [16])((long)&local_828 + lVar11) = auVar20;
    auVar17 = pmovsxwd(auVar20,*(undefined8 *)((long)&uStack_858 + lVar11));
    auVar20 = pmovsxwd(auVar24,*(undefined8 *)((long)auStack_848 + lVar11));
    auVar24 = pmovsxwd(auVar23,*(undefined8 *)((long)auStack_838 + lVar11));
    auVar22 = pmovsxwd(auVar22,*(undefined8 *)((long)&local_828 + lVar11));
    *(int *)((long)&uStack_858 + lVar11) = auVar17._0_4_ << iVar13;
    *(int *)((long)&uStack_858 + lVar11 + 4) = auVar17._4_4_;
    *(int *)((long)&uStack_850 + lVar11) = auVar17._8_4_;
    *(int *)((long)auStack_848 + lVar11 + -4) = auVar17._12_4_;
    in_XMM2._0_4_ = auVar20._0_4_ << iVar13;
    in_XMM2._4_4_ = auVar20._4_4_;
    in_XMM2._8_4_ = auVar20._8_4_;
    in_XMM2._12_4_ = auVar20._12_4_;
    in_XMM3._0_4_ = auVar24._0_4_ << iVar13;
    in_XMM3._4_4_ = auVar24._4_4_;
    in_XMM3._8_4_ = auVar24._8_4_;
    in_XMM3._12_4_ = auVar24._12_4_;
    *(undefined1 (*) [16])((long)auStack_848 + lVar11) = in_XMM2;
    *(undefined1 (*) [16])((long)auStack_838 + lVar11) = in_XMM3;
    in_XMM4._0_4_ = auVar22._0_4_ << iVar13;
    in_XMM4._4_4_ = auVar22._4_4_;
    in_XMM4._8_4_ = auVar22._8_4_;
    in_XMM4._12_4_ = auVar22._12_4_;
    *(undefined1 (*) [16])((long)&local_828 + lVar11) = in_XMM4;
    lVar11 = lVar11 + 0x80;
    puVar15 = (ulong *)((long)puVar15 + (long)stride * 2);
  } while (lVar11 != 0x870);
  auStack_838[1] = 0x422069;
  (*pcVar3)(&local_828,&local_828,0xd,8);
  auStack_838[1] = 0x422078;
  col_txfm_16x16_rounding((__m128i *)&local_828,-(int)piVar8[1]);
  auStack_838[1] = 0x42208c;
  col_txfm_16x16_rounding((__m128i *)local_428,-(int)piVar8[1]);
  piVar9 = coeff + 0x30;
  piVar12 = aiStack_820 + 0x5e;
  lVar11 = 0;
  do {
    lVar14 = -0x40;
    piVar16 = piVar12;
    do {
      iVar6 = piVar16[-0x5f];
      iVar13 = piVar16[-0x3f];
      iVar7 = piVar16[-0x1f];
      iVar5 = piVar16[1];
      auVar25._4_4_ = piVar16[-0x40];
      auVar25._0_4_ = piVar16[-0x60];
      auVar27._0_8_ = CONCAT44(piVar16[-0x3e],piVar16[-0x5e]);
      auVar27._8_4_ = piVar16[-0x5d];
      auVar27._12_4_ = piVar16[-0x3d];
      auVar25._12_4_ = *piVar16;
      auVar25._8_4_ = piVar16[-0x20];
      auVar21._0_8_ = CONCAT44(piVar16[2],piVar16[-0x1e]);
      auVar21._8_4_ = piVar16[-0x1d];
      auVar21._12_4_ = piVar16[3];
      *(undefined1 (*) [16])((long)piVar9 + lVar14 + -0x80) = auVar25;
      *(int *)((long)piVar9 + lVar14 + -0x38) = iVar6;
      *(int *)((long)piVar9 + lVar14 + -0x34) = iVar13;
      *(int *)((long)piVar9 + lVar14 + -0x30) = iVar7;
      *(int *)((long)piVar9 + lVar14 + -0x2c) = iVar5;
      auVar18._8_8_ = auVar21._0_8_;
      auVar18._0_8_ = auVar27._0_8_;
      *(undefined1 (*) [16])((long)piVar9 + lVar14) = auVar18;
      puVar1 = (undefined8 *)((long)piVar9 + lVar14 + 0x40);
      *puVar1 = auVar27._8_8_;
      puVar1[1] = auVar21._8_8_;
      piVar16 = piVar16 + 0x80;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0);
    lVar11 = lVar11 + 1;
    piVar9 = piVar9 + 0x40;
    piVar12 = piVar12 + 4;
  } while (lVar11 != 8);
  lVar11 = 0;
  do {
    auStack_838[1] = 0x422140;
    (*pcVar4)((long)coeff + lVar11,(long)&local_828 + lVar11,0xd,4);
    auVar19._8_8_ = extraout_XMM1_Qb;
    auVar19._0_8_ = extraout_XMM1_Qa;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x40);
  bVar2 = piVar8[2];
  if ((char)bVar2 < '\0') {
    iVar13 = 1 << (~bVar2 & 0x1f);
    lVar11 = 0;
    auVar17 = ZEXT416((uint)-(int)(char)bVar2);
    auVar20 = pmovsxwd(auVar21,0x16a116a116a116a1);
    auVar24 = pmovsxwd(auVar25,0x800080008000800);
    do {
      auVar28._0_4_ = *(int *)((long)&local_828 + lVar11) + iVar13 >> auVar17;
      auVar28._4_4_ = *(int *)((long)aiStack_820 + lVar11 + -4) + iVar13 >> auVar17;
      auVar28._8_4_ = *(int *)((long)aiStack_820 + lVar11) + iVar13 >> auVar17;
      auVar28._12_4_ = *(int *)((long)aiStack_820 + lVar11 + 4) + iVar13 >> auVar17;
      auVar22 = pmulld(auVar28,auVar20);
      piVar12 = (int *)((long)coeff + lVar11);
      *piVar12 = auVar22._0_4_ + auVar24._0_4_ >> 0xc;
      piVar12[1] = auVar22._4_4_ + auVar24._4_4_ >> 0xc;
      piVar12[2] = auVar22._8_4_ + auVar24._8_4_ >> 0xc;
      piVar12[3] = auVar22._12_4_ + auVar24._12_4_ >> 0xc;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x800);
  }
  else {
    lVar11 = 0;
    auVar17 = pmovsxwd(auVar19,0x16a116a116a116a1);
    auVar20 = pmovsxwd(auVar21,0x800080008000800);
    do {
      auVar26._0_4_ = *(int *)((long)&local_828 + lVar11) << (int)(char)bVar2;
      auVar26._4_4_ = *(undefined4 *)((long)aiStack_820 + lVar11 + -4);
      auVar26._8_4_ = *(undefined4 *)((long)aiStack_820 + lVar11);
      auVar26._12_4_ = *(undefined4 *)((long)aiStack_820 + lVar11 + 4);
      auVar24 = pmulld(auVar26,auVar17);
      piVar12 = (int *)((long)coeff + lVar11);
      *piVar12 = auVar24._0_4_ + auVar20._0_4_ >> 0xc;
      piVar12[1] = auVar24._4_4_ + auVar20._4_4_ >> 0xc;
      piVar12[2] = auVar24._8_4_ + auVar20._8_4_ >> 0xc;
      piVar12[3] = auVar24._12_4_ + auVar20._12_4_ >> 0xc;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x800);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_32x16_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[128];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X16];
  const int txw_idx = get_txw_idx(TX_32X16);
  const int txh_idx = get_txh_idx(TX_32X16);
  const fwd_transform_1d_sse4_1 col_txfm = row_highbd_txfm8x32_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = col_highbd_txfm8x32_arr[tx_type];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];

  // column transform
  load_buffer_32x8n(input, in, stride, 0, 0, shift[0], 16);
  col_txfm(in, in, bitcol, 8);
  col_txfm_16x16_rounding(&in[0], -shift[1]);
  col_txfm_16x16_rounding(&in[64], -shift[1]);
  transpose_8nx8n(in, outcoef128, 32, 16);

  // row transform
  for (int i = 0; i < 4; i++) {
    row_txfm((outcoef128 + i), (in + i), bitrow, 4);
  }
  av1_round_shift_rect_array_32_sse4_1(in, outcoef128, 128, -shift[2],
                                       NewSqrt2);
  (void)bd;
}